

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closeAllCursors(Vdbe *p)

{
  VdbeFrame *p_00;
  VdbeFrame *pDel;
  VdbeFrame *pFrame;
  Vdbe *p_local;
  
  if (p->pFrame != (VdbeFrame *)0x0) {
    for (pDel = p->pFrame; pDel->pParent != (VdbeFrame *)0x0; pDel = pDel->pParent) {
    }
    sqlite3VdbeFrameRestore(pDel);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem,p->nMem);
  }
  while (p->pDelFrame != (VdbeFrame *)0x0) {
    p_00 = p->pDelFrame;
    p->pDelFrame = p_00->pParent;
    sqlite3VdbeFrameDelete(p_00);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  return;
}

Assistant:

static void closeAllCursors(Vdbe *p){
  if( p->pFrame ){
    VdbeFrame *pFrame;
    for(pFrame=p->pFrame; pFrame->pParent; pFrame=pFrame->pParent);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = 0;
    p->nFrame = 0;
  }
  assert( p->nFrame==0 );
  closeCursorsInFrame(p);
  if( p->aMem ){
    releaseMemArray(p->aMem, p->nMem);
  }
  while( p->pDelFrame ){
    VdbeFrame *pDel = p->pDelFrame;
    p->pDelFrame = pDel->pParent;
    sqlite3VdbeFrameDelete(pDel);
  }

  /* Delete any auxdata allocations made by the VM */
  if( p->pAuxData ) sqlite3VdbeDeleteAuxData(p->db, &p->pAuxData, -1, 0);
  assert( p->pAuxData==0 );
}